

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void lodepng_info_init(LodePNGInfo *info)

{
  LodePNGInfo *in_RDI;
  
  lodepng_color_mode_init(&in_RDI->color);
  in_RDI->interlace_method = 0;
  in_RDI->compression_method = 0;
  in_RDI->filter_method = 0;
  in_RDI->background_defined = 0;
  in_RDI->background_b = 0;
  in_RDI->background_g = 0;
  in_RDI->background_r = 0;
  LodePNGText_init(in_RDI);
  LodePNGIText_init(in_RDI);
  in_RDI->time_defined = 0;
  in_RDI->phys_defined = 0;
  in_RDI->gama_defined = 0;
  in_RDI->chrm_defined = 0;
  in_RDI->srgb_defined = 0;
  in_RDI->iccp_defined = 0;
  in_RDI->iccp_name = (char *)0x0;
  in_RDI->iccp_profile = (uchar *)0x0;
  LodePNGUnknownChunks_init(in_RDI);
  return;
}

Assistant:

void lodepng_info_init(LodePNGInfo* info)
{
  lodepng_color_mode_init(&info->color);
  info->interlace_method = 0;
  info->compression_method = 0;
  info->filter_method = 0;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
  info->background_defined = 0;
  info->background_r = info->background_g = info->background_b = 0;

  LodePNGText_init(info);
  LodePNGIText_init(info);

  info->time_defined = 0;
  info->phys_defined = 0;

  info->gama_defined = 0;
  info->chrm_defined = 0;
  info->srgb_defined = 0;
  info->iccp_defined = 0;
  info->iccp_name = NULL;
  info->iccp_profile = NULL;

  LodePNGUnknownChunks_init(info);
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
}